

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpudpv4transmitter.cpp
# Opt level: O1

bool __thiscall jrtplib::RTPUDPv4Transmitter::SupportsMulticasting(RTPUDPv4Transmitter *this)

{
  if (this->init == true) {
    return (bool)(this->supportsmulticasting & this->created);
  }
  return false;
}

Assistant:

bool RTPUDPv4Transmitter::SupportsMulticasting()
{
	if (!init)
		return false;
	
	MAINMUTEX_LOCK
	
	bool v;
		
	if (!created)
		v = false;
	else
		v = supportsmulticasting;

	MAINMUTEX_UNLOCK
	return v;
}